

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O0

void __thiscall
swutil::SharedPtr<KeyFileReader<NWN::ResRef16>_>::~SharedPtr
          (SharedPtr<KeyFileReader<NWN::ResRef16>_> *this)

{
  LONG_PTR LVar1;
  KeyFileReader<NWN::ResRef16> *in_RDI;
  
  if (((in_RDI->super_IResourceAccessor<NWN::ResRef32>)._vptr_IResourceAccessor != (_func_int **)0x0
      ) && (LVar1 = InterlockedDecrementPtr
                              ((LONG_PTR *)
                               (in_RDI->super_IResourceAccessor<NWN::ResRef32>).
                               _vptr_IResourceAccessor), LVar1 == 0)) {
    SharedPtrDeleterDelete<KeyFileReader<NWN::ResRef16>>(in_RDI);
    SharedPtrDeleteSharedState((LONG_PTR *)0x219ae2);
  }
  return;
}

Assistant:

~SharedPtr()
		{
			if (m_SharedState)
			{
				if (!InterlockedDecrementPtr( m_SharedState ))
				{
					SharedPtrDeleterDelete( m_Ptr );
					SharedPtrDeleteSharedState( m_SharedState );
				}
			}
		}